

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pass.cpp
# Opt level: O2

void __thiscall spvtools::opt::MemPass::RemoveBlock(MemPass *this,iterator *bi)

{
  BasicBlock *this_00;
  type tVar1;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  this_00 = (((bi->iterator_)._M_current)->_M_t).
            super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
            .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
  local_28 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/mem_pass.cpp:401:24)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/mem_pass.cpp:401:24)>
             ::_M_manager;
  local_40._M_unused._0_8_ = (undefined8)this_00;
  local_40._8_8_ = this;
  BasicBlock::ForEachInst(this_00,(function<void_(spvtools::opt::Instruction_*)> *)&local_40,false);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  IRContext::KillInst((this->super_Pass).context_,
                      (Instruction *)
                      (this_00->label_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                      ._M_t);
  tVar1 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::Erase<false>(bi);
  bi->container_ = tVar1.container_;
  bi->iterator_ = (UnderlyingIterator)tVar1.iterator_._M_current;
  return;
}

Assistant:

void MemPass::RemoveBlock(Function::iterator* bi) {
  auto& rm_block = **bi;

  // Remove instructions from the block.
  rm_block.ForEachInst([&rm_block, this](Instruction* inst) {
    // Note that we do not kill the block label instruction here. The label
    // instruction is needed to identify the block, which is needed by the
    // removal of phi operands.
    if (inst != rm_block.GetLabelInst()) {
      context()->KillInst(inst);
    }
  });

  // Remove the label instruction last.
  auto label = rm_block.GetLabelInst();
  context()->KillInst(label);

  *bi = bi->Erase();
}